

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eia608.c
# Opt level: O1

int eia608_parse_preamble
              (uint16_t cc_data,int *row,int *col,eia608_style_t *style,int *chan,int *underline)

{
  uint uVar1;
  
  *row = eia608_row_map[cc_data >> 5 & 1 | cc_data >> 7 & 0xe];
  *chan = cc_data >> 0xb & 1;
  *underline = cc_data & 1;
  if ((cc_data & 0x10) == 0) {
    *style = cc_data >> 1 & eia608_style_italics;
    uVar1 = 0;
  }
  else {
    *style = eia608_style_white;
    uVar1 = (uint)cc_data * 2 & 0x1c;
  }
  *col = uVar1;
  return 1;
}

Assistant:

int eia608_parse_preamble(uint16_t cc_data, int* row, int* col, eia608_style_t* style, int* chan, int* underline)
{
    (*row) = eia608_row_map[((0x0700 & cc_data) >> 7) | ((0x0020 & cc_data) >> 5)];
    (*chan) = !!(0x0800 & cc_data);
    (*underline) = 0x0001 & cc_data;

    if (0x0010 & cc_data) {
        (*style) = eia608_style_white;
        (*col) = 4 * ((0x000E & cc_data) >> 1);
    } else {
        (*style) = (0x000E & cc_data) >> 1;
        (*col) = 0;
    }

    return 1;
}